

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_active_uniform_blockiv
               (NegativeTestContext *ctx)

{
  ostringstream *this;
  RenderContext *renderCtx;
  GLuint program_00;
  allocator<char> local_2ea;
  allocator<char> local_2e9;
  GLint params;
  GLint numActiveBlocks;
  string local_2a8;
  string local_288;
  undefined1 local_268 [384];
  ShaderProgram program;
  
  renderCtx = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,
             "${GLSL_VERSION_DECL}\nuniform mediump vec4 vUnif_vec4;\nin mediump vec4 attr;layout(shared) uniform Block { mediump vec4 blockVar; };\nvoid main (void)\n{\n\tgl_Position = vUnif_vec4 + blockVar + attr;\n}\n"
             ,&local_2ea);
  getVtxFragVersionSources((string *)&params,&local_288,ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,
             "${GLSL_VERSION_DECL}\nuniform mediump ivec4 fUnif_ivec4;\nuniform mediump uvec4 fUnif_uvec4;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(vec4(fUnif_ivec4) + vec4(fUnif_uvec4));\n}\n"
             ,&local_2e9);
  getVtxFragVersionSources((string *)&numActiveBlocks,&local_2a8,ctx);
  glu::makeVtxFragSources((ProgramSources *)local_268,(string *)&params,(string *)&numActiveBlocks);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)local_268);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_268);
  std::__cxx11::string::~string((string *)&numActiveBlocks);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&params);
  std::__cxx11::string::~string((string *)&local_288);
  program_00 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  params = -1;
  numActiveBlocks = -1;
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,program.m_program.m_program,0x8a36,&numActiveBlocks);
  local_268._0_8_ = (ctx->super_CallLogWrapper).m_log;
  this = (ostringstream *)(local_268 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::operator<<((ostream *)this,"// GL_ACTIVE_UNIFORM_BLOCKS = ");
  std::ostream::operator<<(this,numActiveBlocks);
  std::operator<<((ostream *)this," (expected 1).");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  NegativeTestContext::expectError(ctx,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_268,
             "GL_INVALID_VALUE is generated if program is not the name of either a program or shader object."
             ,&local_2ea);
  NegativeTestContext::beginSection(ctx,(string *)local_268);
  std::__cxx11::string::~string((string *)local_268);
  glu::CallLogWrapper::glGetActiveUniformBlockiv
            (&ctx->super_CallLogWrapper,0xffffffff,0,0x8a3f,&params);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_268,
             "GL_INVALID_OPERATION is generated if program is the name of a shader object",
             &local_2ea);
  NegativeTestContext::beginSection(ctx,(string *)local_268);
  std::__cxx11::string::~string((string *)local_268);
  glu::CallLogWrapper::glGetActiveUniformBlockiv
            (&ctx->super_CallLogWrapper,program_00,0,0x8a3f,&params);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_268,
             "GL_INVALID_VALUE is generated if uniformBlockIndex is greater than or equal to the value of GL_ACTIVE_UNIFORM_BLOCKS or is not the index of an active uniform block in program."
             ,&local_2ea);
  NegativeTestContext::beginSection(ctx,(string *)local_268);
  std::__cxx11::string::~string((string *)local_268);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetActiveUniformBlockiv
            (&ctx->super_CallLogWrapper,program.m_program.m_program,numActiveBlocks,0x8a3f,&params);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_268,
             "GL_INVALID_ENUM is generated if pname is not one of the accepted tokens.",&local_2ea);
  NegativeTestContext::beginSection(ctx,(string *)local_268);
  std::__cxx11::string::~string((string *)local_268);
  glu::CallLogWrapper::glGetActiveUniformBlockiv
            (&ctx->super_CallLogWrapper,program.m_program.m_program,0,0xffffffff,&params);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::ShaderProgram::~ShaderProgram(&program);
  return;
}

Assistant:

void get_active_uniform_blockiv (NegativeTestContext& ctx)
{
	glu::ShaderProgram	program			(ctx.getRenderContext(), glu::makeVtxFragSources(getVtxFragVersionSources(uniformTestVertSource, ctx), getVtxFragVersionSources(uniformTestFragSource, ctx)));
	GLuint				shader			= ctx.glCreateShader(GL_VERTEX_SHADER);
	GLint				params			= -1;
	GLint				numActiveBlocks	= -1;

	ctx.glGetProgramiv(program.getProgram(), GL_ACTIVE_UNIFORM_BLOCKS, &numActiveBlocks);
	ctx.getLog() << TestLog::Message << "// GL_ACTIVE_UNIFORM_BLOCKS = " << numActiveBlocks << " (expected 1)." << TestLog::EndMessage;
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not the name of either a program or shader object.");
	ctx.glGetActiveUniformBlockiv(-1, 0, GL_UNIFORM_BLOCK_BINDING, &params);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is the name of a shader object");
	ctx.glGetActiveUniformBlockiv(shader, 0, GL_UNIFORM_BLOCK_BINDING, &params);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if uniformBlockIndex is greater than or equal to the value of GL_ACTIVE_UNIFORM_BLOCKS or is not the index of an active uniform block in program.");
	ctx.glUseProgram(program.getProgram());
	ctx.expectError(GL_NO_ERROR);
	ctx.glGetActiveUniformBlockiv(program.getProgram(), numActiveBlocks, GL_UNIFORM_BLOCK_BINDING, &params);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not one of the accepted tokens.");
	ctx.glGetActiveUniformBlockiv(program.getProgram(), 0, -1, &params);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.glUseProgram(0);
}